

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindFileInFallbackDatabase(DescriptorPool *this,string *name)

{
  byte bVar1;
  size_type sVar2;
  undefined8 in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar3;
  FileDescriptorProto *in_stack_00000010;
  DescriptorPool *in_stack_00000018;
  FileDescriptorProto file_proto;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffec0;
  value_type *in_stack_fffffffffffffec8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  FileDescriptorProto *in_stack_ffffffffffffff10;
  bool local_1;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_1 = false;
  }
  else {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4904d6);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffec0._M_cur,
                    (key_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    if (sVar2 == 0) {
      this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff10;
      FileDescriptorProto::FileDescriptorProto(in_stack_ffffffffffffff10);
      bVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),in_RSI,this_00);
      if (((bVar1 & 1) == 0) ||
         (in_stack_fffffffffffffec8 =
               (value_type *)BuildFileFromDatabase(in_stack_00000018,in_stack_00000010),
         in_stack_fffffffffffffec8 == (value_type *)0x0)) {
        std::
        unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
        ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      *)0x49056a);
        pVar3 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(this_00,in_stack_fffffffffffffec8);
        in_stack_fffffffffffffec0._M_cur =
             (__node_type *)
             pVar3.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        local_1 = false;
      }
      else {
        local_1 = true;
      }
      FileDescriptorProto::~FileDescriptorProto
                ((FileDescriptorProto *)in_stack_fffffffffffffec0._M_cur);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool DescriptorPool::TryFindFileInFallbackDatabase(
    const std::string& name) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_files_.count(name) > 0) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileByName(name, &file_proto) ||
      BuildFileFromDatabase(file_proto) == nullptr) {
    tables_->known_bad_files_.insert(name);
    return false;
  }
  return true;
}